

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtooltip.cpp
# Opt level: O1

void QToolTip::showText(QPoint *pos,QString *text,QWidget *w,QRect *rect,int msecDisplayTime)

{
  QWidgetPrivate *this;
  bool bVar1;
  QTipLabel *this_00;
  QScreen *screen;
  long in_FS_OFFSET;
  QAnyStringView QVar2;
  QPoint localPos;
  QPoint local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((QTipLabel::instance == (QTipLabel *)0x0) ||
     ((((QTipLabel::instance->super_QLabel).super_QFrame.super_QWidget.data)->widget_attributes &
      0x8000) == 0)) {
LAB_003a5fe9:
    if ((text->d).size != 0) {
      this_00 = (QTipLabel *)operator_new(0x58);
      QTipLabel::QTipLabel(this_00,text,pos,w,msecDisplayTime);
      this = *(QWidgetPrivate **)
              &(QTipLabel::instance->super_QLabel).super_QFrame.super_QWidget.field_0x8;
      screen = QTipLabel::getTipScreen(pos,w);
      QWidgetPrivate::setScreen(this,screen);
      QTipLabel::setTipRect(QTipLabel::instance,w,rect);
      QTipLabel::placeTip(QTipLabel::instance,pos,w);
      QVar2.m_size = (size_t)"qtooltip_label";
      QVar2.field_0.m_data = QTipLabel::instance;
      QObject::setObjectName(QVar2);
      bVar1 = QApplication::isEffectEnabled(UI_FadeTooltip);
      if (bVar1) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          qFadeEffect((QWidget *)QTipLabel::instance,-1);
          return;
        }
      }
      else {
        bVar1 = QApplication::isEffectEnabled(UI_AnimateTooltip);
        if (bVar1) {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            qScrollEffect((QWidget *)QTipLabel::instance,8,-1);
            return;
          }
        }
        else if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          QWidget::showNormal((QWidget *)QTipLabel::instance);
          return;
        }
      }
      goto LAB_003a6207;
    }
  }
  else if ((text->d).size == 0) {
    if ((QTipLabel::instance->hideTimer).m_id == Invalid) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        QBasicTimer::start(&QTipLabel::instance->hideTimer,300000000,1);
        return;
      }
      goto LAB_003a6207;
    }
  }
  else {
    if (QTipLabel::instance->fadingOut != false) goto LAB_003a5fe9;
    local_40 = *pos;
    if (w != (QWidget *)0x0) {
      local_40 = QWidget::mapFromGlobal(w,pos);
    }
    bVar1 = QTipLabel::tipChanged(QTipLabel::instance,&local_40,text,&w->super_QObject);
    if (bVar1) {
      QTipLabel::reuseTip(QTipLabel::instance,text,msecDisplayTime,pos);
      QTipLabel::setTipRect(QTipLabel::instance,w,rect);
      QTipLabel::placeTip(QTipLabel::instance,pos,w);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_003a6207:
  __stack_chk_fail();
}

Assistant:

void QToolTip::showText(const QPoint &pos, const QString &text, QWidget *w, const QRect &rect, int msecDisplayTime)
{
    if (QTipLabel::instance && QTipLabel::instance->isVisible()) { // a tip does already exist
        if (text.isEmpty()){ // empty text means hide current tip
            QTipLabel::instance->hideTip();
            return;
        } else if (!QTipLabel::instance->fadingOut) {
            // If the tip has changed, reuse the one
            // that is showing (removes flickering)
            QPoint localPos = pos;
            if (w)
                localPos = w->mapFromGlobal(pos);
            if (QTipLabel::instance->tipChanged(localPos, text, w)){
                QTipLabel::instance->reuseTip(text, msecDisplayTime, pos);
                QTipLabel::instance->setTipRect(w, rect);
                QTipLabel::instance->placeTip(pos, w);
            }
            return;
        }
    }

    if (!text.isEmpty()) { // no tip can be reused, create new tip:
        QWidget *tipLabelParent = [w]() -> QWidget* {
#ifdef Q_OS_WIN32
            // On windows, we can't use the widget as parent otherwise the window will be
            // raised when the tooltip will be shown
            Q_UNUSED(w);
            return nullptr;
#else
            return w;
#endif
        }();
        new QTipLabel(text, pos, tipLabelParent, msecDisplayTime); // sets QTipLabel::instance to itself
        QWidgetPrivate::get(QTipLabel::instance)->setScreen(QTipLabel::getTipScreen(pos, w));
        QTipLabel::instance->setTipRect(w, rect);
        QTipLabel::instance->placeTip(pos, w);
        QTipLabel::instance->setObjectName("qtooltip_label"_L1);

#if QT_CONFIG(effects)
        if (QApplication::isEffectEnabled(Qt::UI_FadeTooltip))
            qFadeEffect(QTipLabel::instance);
        else if (QApplication::isEffectEnabled(Qt::UI_AnimateTooltip))
            qScrollEffect(QTipLabel::instance);
        else
            QTipLabel::instance->showNormal();
#else
        QTipLabel::instance->showNormal();
#endif
    }
}